

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O3

SURFACE_TRANSFORM
Diligent::VkSurfaceTransformFlagToSurfaceTransform(VkSurfaceTransformFlagBitsKHR vkTransformFlag)

{
  VkSurfaceTransformFlagBitsKHR VVar1;
  string msg;
  string local_38;
  
  VVar1 = vkTransformFlag - VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR;
  if ((vkTransformFlag ^ VVar1) <= VVar1) {
    FormatString<char[38]>(&local_38,(char (*) [38])"Only single transform bit is expected");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"VkSurfaceTransformFlagToSurfaceTransform",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x5e6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if ((int)vkTransformFlag < 0x10) {
    if (VVar1 < VK_SURFACE_TRANSFORM_ROTATE_90_BIT_KHR) {
      return vkTransformFlag;
    }
    if (vkTransformFlag == VK_SURFACE_TRANSFORM_ROTATE_180_BIT_KHR) {
      return SURFACE_TRANSFORM_ROTATE_180;
    }
    if (vkTransformFlag == VK_SURFACE_TRANSFORM_ROTATE_270_BIT_KHR) {
      return SURFACE_TRANSFORM_ROTATE_270;
    }
  }
  else if ((int)vkTransformFlag < 0x40) {
    if (vkTransformFlag == VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_BIT_KHR) {
      return SURFACE_TRANSFORM_HORIZONTAL_MIRROR;
    }
    if (vkTransformFlag == VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_90_BIT_KHR) {
      return SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_90;
    }
  }
  else {
    if (vkTransformFlag == VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_180_BIT_KHR) {
      return SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_180;
    }
    if (vkTransformFlag == VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_270_BIT_KHR) {
      return SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_270;
    }
  }
  FormatString<char[29]>(&local_38,(char (*) [29])"Unexpected surface transform");
  DebugAssertionFailed
            (local_38._M_dataplus._M_p,"VkSurfaceTransformFlagToSurfaceTransform",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
             ,0x5f5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return SURFACE_TRANSFORM_IDENTITY;
}

Assistant:

SURFACE_TRANSFORM VkSurfaceTransformFlagToSurfaceTransform(VkSurfaceTransformFlagBitsKHR vkTransformFlag)
{
    VERIFY(IsPowerOfTwo(static_cast<Uint32>(vkTransformFlag)), "Only single transform bit is expected");

    // clang-format off
    switch (vkTransformFlag)
    {
        case VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR:                     return SURFACE_TRANSFORM_IDENTITY;
        case VK_SURFACE_TRANSFORM_ROTATE_90_BIT_KHR:                    return SURFACE_TRANSFORM_ROTATE_90;
        case VK_SURFACE_TRANSFORM_ROTATE_180_BIT_KHR:                   return SURFACE_TRANSFORM_ROTATE_180;
        case VK_SURFACE_TRANSFORM_ROTATE_270_BIT_KHR:                   return SURFACE_TRANSFORM_ROTATE_270;
        case VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_BIT_KHR:            return SURFACE_TRANSFORM_HORIZONTAL_MIRROR;
        case VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_90_BIT_KHR:  return SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_90;
        case VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_180_BIT_KHR: return SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_180;
        case VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_270_BIT_KHR: return SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_270;

        default:
            UNEXPECTED("Unexpected surface transform");
            return SURFACE_TRANSFORM_IDENTITY;
    }
    // clang-format on
}